

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O1

void __thiscall
LargeGapGrayCode::createCodeFromTheorem2(LargeGapGrayCode *this,int n,int m,int r,int s,int t)

{
  int iVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  LargeGapGrayCode *this_00;
  double dVar5;
  stringstream local_248 [8];
  stringstream ss;
  ostream local_238 [112];
  ios_base local_1c8 [264];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  vector<char,_std::allocator<char>_> P;
  vector<char,_std::allocator<char>_> Z;
  vector<int,_std::allocator<int>_> t_1;
  vector<char,_std::allocator<char>_> Q;
  
  this_00 = (LargeGapGrayCode *)CONCAT44(in_register_00000034,n);
  if ((((m <= n) && (0 < r && r <= m)) && ((s & 1U) != 0 && 0 < s)) && ((t & 1U) != 0 && 0 < t)) {
    dVar5 = ldexp(1.0,r);
    if (((dVar5 == (double)(s + t)) && (!NAN(dVar5) && !NAN((double)(s + t)))) &&
       (iVar1 = m + n + r, iVar1 < 0x15)) {
      createPVector((vector<char,_std::allocator<char>_> *)local_a0,this_00,s,t);
      dVar5 = ldexp(1.0,n);
      multiCopyVector((vector<char,_std::allocator<char>_> *)
                      &t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,this_00,
                      (vector<char,_std::allocator<char>_> *)local_a0,(int)dVar5);
      uVar3 = ~(uint)t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage +
              (int)Q.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                   ._M_start;
      do {
        if ((int)uVar3 < 0) goto LAB_00103ef7;
        uVar4 = (ulong)uVar3;
        uVar3 = uVar3 - 1;
      } while (*(char *)((long)t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + uVar4) != 'b');
      *(undefined1 *)
       ((long)t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage + uVar4) = 99;
LAB_00103ef7:
      dVar5 = ldexp(1.0,m);
      multiCopyVector((vector<char,_std::allocator<char>_> *)
                      &P.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,this_00,
                      (vector<char,_std::allocator<char>_> *)
                      &t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(int)dVar5);
      createTransitionSequenceTheorem2
                ((vector<int,_std::allocator<int>_> *)
                 &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,this,n,m,r,
                 (vector<char,_std::allocator<char>_> *)
                 &P.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      iVar1 = iVar1 + -1;
      std::vector<int,_std::allocator<int>_>::operator=
                ((this->m_transitionSequences).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar1,
                 (vector<int,_std::allocator<int>_> *)
                 &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::__cxx11::stringstream::stringstream(local_248);
      std::__ostream_insert<char,std::char_traits<char>>(local_238,"(",1);
      poVar2 = (ostream *)std::ostream::operator<<(local_238,n);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," + ",3);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,m);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," + ",3);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,r);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((this->m_creationMethod).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar1),(string *)local_c0);
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0]);
      }
      std::__cxx11::stringstream::~stringstream(local_248);
      std::ios_base::~ios_base(local_1c8);
      if (Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (P.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(P.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(t_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (local_a0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_a0);
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Constraints for Theorem 2 are not satisfied.",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void LargeGapGrayCode::createCodeFromTheorem2(int n, int m, int r, int s, int t)
{
	if(n >= m && m >= r && r >= 1 && isOddPositive(s) && isOddPositive(t) && (s+t) == pow(2,r) && (n+m+r <= maxBitWidth)) {
		std::vector<char> P = createPVector(s, t);
		std::vector<char> Q = multiCopyVector(P, pow(2, n));
		replaceLastBWithC(Q);
		std::vector<char> Z = multiCopyVector(Q, pow(2, m));
		std::vector<int> t = createTransitionSequenceTheorem2(n, m, r, Z);
		m_transitionSequences[n+m+r-1] = t;
		std::stringstream ss;
		ss << "(" << n << " + " << m << " + " << r << ")";
		m_creationMethod[n+m+r-1] = ss.str();
	}
	else {
		std::cout << "Constraints for Theorem 2 are not satisfied." << std::endl;
	}
}